

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *pSVar1;
  SymbolKind *pSVar2;
  pointer ppAVar3;
  UdpBodySyntax *pUVar4;
  long lVar5;
  int *piVar6;
  UdpInitialStmtSyntax *this;
  uint uVar7;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  undefined1 auVar8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ValueSymbol *pVVar10;
  undefined8 uVar11;
  group_type_pointer pgVar12;
  value_type_pointer ppVar13;
  pointer ppPVar14;
  TimeScaleMagnitude TVar15;
  byte bVar16;
  bool bVar17;
  logic_t lVar18;
  logic_t lVar19;
  char cVar20;
  byte bVar21;
  char stateChar;
  char cVar22;
  char cVar23;
  __type_conflict3 _Var24;
  int iVar25;
  bitwidth_t bVar26;
  Compilation *this_00;
  SyntaxNode *pSVar27;
  UdpPortDeclSyntax *pUVar28;
  SourceLocation SVar29;
  PrimitivePortSymbol *pPVar30;
  ulong uVar31;
  IdentifierNameSyntax *pIVar32;
  uint64_t uVar33;
  Info *pIVar34;
  pointer pDVar35;
  SyntaxNode *pSVar36;
  undefined4 extraout_var;
  Diagnostic *pDVar37;
  Expression *this_01;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_02;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var38;
  ParentList *pPVar39;
  SourceLocation SVar40;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  undefined8 extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *pEVar41;
  size_t extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  long extraout_RDX_15;
  uint uVar42;
  size_type __n;
  SyntaxNode **ppSVar43;
  char *this_03;
  UdpOutputPortDeclSyntax *outputDecl;
  size_t sVar44;
  long lVar45;
  basic_string_view<char,_std::char_traits<char>_> *pbVar46;
  UdpInputPortDeclSyntax *pUVar47;
  UdpInputPortDeclSyntax *pUVar48;
  SourceLocation SVar49;
  Compilation *pCVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  TimeUnit TVar56;
  TimeScaleMagnitude TVar57;
  TimeUnit TVar58;
  byte bVar59;
  TimeScaleMagnitude TVar60;
  byte bVar61;
  TimeUnit TVar62;
  TimeScaleMagnitude TVar63;
  byte bVar64;
  TimeUnit TVar65;
  byte bVar66;
  TimeScaleMagnitude TVar67;
  byte bVar68;
  TimeUnit TVar69;
  TimeScaleMagnitude TVar70;
  byte bVar71;
  TimeUnit TVar72;
  byte bVar73;
  TimeScaleMagnitude TVar74;
  byte bVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  byte bVar78;
  undefined1 uVar79;
  byte bVar80;
  undefined1 uVar81;
  byte bVar82;
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange SVar83;
  string_view sVar84;
  basic_string_view<char,_std::char_traits<char>_> __x;
  char local_321;
  Compilation *local_320;
  SourceLocation local_318;
  Compilation *local_310;
  PrimitivePortSymbol *port_1;
  byte *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined8 local_2e8;
  undefined1 uStack_2e0;
  byte bStack_2df;
  byte bStack_2de;
  byte bStack_2dd;
  undefined1 uStack_2dc;
  byte bStack_2db;
  byte bStack_2da;
  byte bStack_2d9;
  PrimitivePortSymbol *port;
  SourceLocation SStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [3];
  anon_class_8_1_a89d2d74 checkDup;
  Token name_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [3];
  UdpInputPortDeclSyntax *inputDecl_1;
  TimeUnit TStack_240;
  TimeScaleMagnitude TStack_23f;
  TimeUnit TStack_23e;
  TimeScaleMagnitude TStack_23d;
  _Storage<slang::TimeScale,_true> a_Stack_23c [3];
  SourceLocation local_230;
  SourceLocation local_228;
  undefined1 uStack_220;
  byte bStack_21f;
  byte bStack_21e;
  byte bStack_21d;
  undefined1 uStack_21c;
  byte bStack_21b;
  byte bStack_21a;
  byte bStack_219;
  UdpDeclarationSyntax *local_210;
  BumpAllocator alloc;
  iterator __begin5;
  undefined1 local_1d0 [56];
  string_view primName;
  iterator __begin3;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
  local_120;
  pointer local_e0;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> trieAlloc;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  undefined4 extraout_var_00;
  
  pCVar50 = scope->compilation;
  primName = parsing::Token::valueText(&syntax->name);
  __begin3.list = (ParentList *)parsing::Token::location(&syntax->name);
  auVar8._12_4_ = 0;
  auVar8._0_12_ = (undefined1  [12])__begin5._4_12_;
  __begin5 = (iterator)(auVar8 << 0x20);
  this_00 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&pCVar50->super_BumpAllocator,pCVar50,&primName,(SourceLocation *)&__begin3,
                       (PrimitiveKind *)&__begin5);
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  this_03 = (char *)scope;
  Symbol::setAttributes((Symbol *)this_00,scope,syntax_00);
  *(UdpDeclarationSyntax **)&(this_00->options).maxUDPCoverageNotes = syntax;
  pSVar36 = &((syntax->portList).ptr)->super_SyntaxNode;
  pEVar41 = extraout_RDX;
  local_320 = this_00;
  local_310 = pCVar50;
  local_210 = syntax;
  if (pSVar36->kind == WildcardUdpPortList) {
    this_03 = (char *)primName._M_len;
    pSVar27 = Compilation::getExternDefinition(pCVar50,primName,scope);
    if ((pSVar27 == (SyntaxNode *)0x0) || (pSVar27->kind != ExternUdpDecl)) {
      SVar83 = slang::syntax::SyntaxNode::sourceRange(pSVar36);
      pDVar37 = Scope::addDiag(scope,(DiagCode)0x7d0006,SVar83);
      this_03 = (char *)primName._M_len;
      Diagnostic::operator<<(pDVar37,primName);
      pEVar41 = extraout_RDX_01;
    }
    else {
      pSVar36 = pSVar27[7].previewNode;
      pEVar41 = extraout_RDX_00;
    }
  }
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ =
       (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len = 0;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.cap = 5;
  if (pSVar36->kind == NonAnsiUdpPortList) {
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
    ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                *)&__begin3);
    pPVar30 = (PrimitivePortSymbol *)&pSVar36[1].previewNode;
    SStack_2d0 = (SourceLocation)0x0;
    port = pPVar30;
    local_318 = (SourceLocation)((ulong)((long)&(pSVar36[3].previewNode)->kind + 1) >> 1);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_320->options;
    SVar29 = (SourceLocation)0x0;
    local_2e8 = pPVar30;
    while( true ) {
      if ((pPVar30 == local_2e8) && (SVar29 == local_318)) break;
      pIVar32 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                iterator_base<slang::syntax::IdentifierNameSyntax_*>::dereference
                          ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&port);
      name_1 = pIVar32->identifier;
      __begin5 = (iterator)parsing::Token::valueText(&name_1);
      SVar29 = parsing::Token::location(&name_1);
      port_1 = (PrimitivePortSymbol *)SVar29;
      alloc.head._0_4_ = 0;
      checkDup.scope =
           (Scope *)BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                              (&local_310->super_BumpAllocator,local_310,
                               (basic_string_view<char,_std::char_traits<char>_> *)&__begin5,
                               (SourceLocation *)&port_1,(PrimitivePortDirection *)&alloc);
      SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
      emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,
                 (PrimitivePortSymbol **)&checkDup);
      Scope::addMember((Scope *)(paVar9 + 3),(Symbol *)checkDup.scope);
      sVar84 = parsing::Token::valueText(&name_1);
      if (sVar84._M_len != 0) {
        _port_1 = parsing::Token::valueText(&name_1);
        uVar33 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_120,(basic_string_view<char,_std::char_traits<char>_> *)&port_1);
        SVar49 = (SourceLocation)(uVar33 >> ((byte)local_120.arrays.groups_size_index & 0x3f));
        lVar45 = (uVar33 & 0xff) * 4;
        TVar56 = (&UNK_0040c7ac)[lVar45];
        TVar57 = (&UNK_0040c7ad)[lVar45];
        TVar58 = (&UNK_0040c7ae)[lVar45];
        TVar60 = (&UNK_0040c7af)[lVar45];
        SVar29 = (SourceLocation)0x0;
        SVar40 = SVar49;
        TVar62 = TVar56;
        TVar63 = TVar57;
        TVar65 = TVar58;
        TVar67 = TVar60;
        TVar69 = TVar56;
        TVar70 = TVar57;
        TVar72 = TVar58;
        TVar74 = TVar60;
        uVar76 = TVar56;
        uVar77 = TVar57;
        uVar79 = TVar58;
        uVar81 = TVar60;
        do {
          ppVar13 = local_120.arrays.elements_;
          pgVar12 = local_120.arrays.groups_;
          pSVar2 = &((Symbol *)(local_120.arrays.groups_)->m)->kind + (long)SVar40 * 4;
          TVar15 = *(char *)((long)pSVar2 + 0xf);
          auVar52[0] = -((TimeUnit)*pSVar2 == TVar56);
          auVar52[1] = -(*(byte *)((long)pSVar2 + 1) == TVar57);
          auVar52[2] = -(*(byte *)((long)pSVar2 + 2) == TVar58);
          auVar52[3] = -(*(byte *)((long)pSVar2 + 3) == TVar60);
          auVar52[4] = -(*(TimeUnit *)(pSVar2 + 1) == TVar62);
          auVar52[5] = -(*(char *)((long)pSVar2 + 5) == TVar63);
          auVar52[6] = -(*(char *)((long)pSVar2 + 6) == TVar65);
          auVar52[7] = -(*(char *)((long)pSVar2 + 7) == TVar67);
          auVar52[8] = -((TimeUnit)((string_view *)(pSVar2 + 2))->_M_len == TVar69);
          auVar52[9] = -(*(char *)((long)pSVar2 + 9) == TVar70);
          auVar52[10] = -(*(char *)((long)pSVar2 + 10) == TVar72);
          auVar52[0xb] = -(*(char *)((long)pSVar2 + 0xb) == TVar74);
          auVar52[0xc] = -(*(TimeUnit *)(pSVar2 + 3) == uVar76);
          auVar52[0xd] = -(*(char *)((long)pSVar2 + 0xd) == uVar77);
          auVar52[0xe] = -(*(char *)((long)pSVar2 + 0xe) == uVar79);
          auVar52[0xf] = -(TVar15 == uVar81);
          uVar42 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe);
          if (uVar42 != 0) {
            inputDecl_1 = (UdpInputPortDeclSyntax *)
                          CONCAT17(TVar67,CONCAT16(TVar65,CONCAT15(TVar63,CONCAT14(TVar62,CONCAT13(
                                                  TVar60,CONCAT12(TVar58,CONCAT11(TVar57,TVar56)))))
                                                  ));
            TStack_240 = TVar69;
            TStack_23f = TVar70;
            TStack_23e = TVar72;
            TStack_23d = TVar74;
            a_Stack_23c[0]._0_1_ = uVar76;
            a_Stack_23c[0]._1_1_ = uVar77;
            a_Stack_23c[0]._2_1_ = uVar79;
            a_Stack_23c[0]._3_1_ = uVar81;
            local_230 = SVar40;
            local_228 = SVar29;
            do {
              uVar7 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&local_120,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&port_1,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  (&(((Type *)((long)ppVar13 + (long)SVar40 * 5 * 0x48))->
                                    super_Symbol).kind + (ulong)uVar7 * 6));
              if (bVar17) goto LAB_001ee335;
              uVar42 = uVar42 - 1 & uVar42;
            } while (uVar42 != 0);
            TVar15 = ((slot_type *)((long)&(&((Symbol *)pgVar12->m)->name)[(long)SVar40]._M_len + 7)
                     )->n;
            SVar29 = local_228;
            SVar40 = local_230;
            TVar56 = (TimeUnit)inputDecl_1;
            TVar57 = inputDecl_1._1_1_;
            TVar58 = inputDecl_1._2_1_;
            TVar60 = inputDecl_1._3_1_;
            TVar62 = inputDecl_1._4_1_;
            TVar63 = inputDecl_1._5_1_;
            TVar65 = inputDecl_1._6_1_;
            TVar67 = inputDecl_1._7_1_;
            TVar69 = TStack_240;
            TVar70 = TStack_23f;
            TVar72 = TStack_23e;
            TVar74 = TStack_23d;
            uVar76 = a_Stack_23c[0]._M_value.base.unit;
            uVar77 = a_Stack_23c[0]._M_value.base.magnitude;
            uVar79 = a_Stack_23c[0]._M_value.precision.unit;
            uVar81 = a_Stack_23c[0]._M_value.precision.magnitude;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7] & TVar15) == 0) break;
          lVar45 = (long)SVar40 + (long)SVar29;
          SVar29 = (SourceLocation)((long)SVar29 + 1);
          SVar40 = (SourceLocation)(lVar45 + 1U & local_120.arrays.groups_size_mask);
        } while ((ulong)SVar29 <= local_120.arrays.groups_size_mask);
        if (local_120.size_ctrl.size < local_120.size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                    ((locator *)&__begin5,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                      *)&local_120,(size_t)SVar49,uVar33,(try_emplace_args_t *)&alloc,
                     (basic_string_view<char,_std::char_traits<char>_> *)&port_1,
                     (PrimitivePortSymbol **)&checkDup);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                    ((locator *)&__begin5,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                      *)&local_120,uVar33,(try_emplace_args_t *)&alloc,
                     (basic_string_view<char,_std::char_traits<char>_> *)&port_1,
                     (PrimitivePortSymbol **)&checkDup);
        }
      }
LAB_001ee335:
      pPVar30 = port;
      SVar29 = (SourceLocation)((long)(char **)SStack_2d0 + 1);
      SStack_2d0 = SVar29;
    }
    pUVar4 = (local_210->body).ptr;
    pSVar1 = &pUVar4->portDecls;
    __begin5.index = 0;
    __begin5.list = (ParentList *)pSVar1;
    local_e0 = (pointer)((pUVar4->portDecls).elements._M_extent._M_extent_value + 1 >> 1);
    pDVar35 = (pointer)0x0;
    pPVar39 = (ParentList *)pSVar1;
    pUVar47 = (UdpInputPortDeclSyntax *)0x0;
    checkDup.scope = scope;
    while ((pPVar39 != (ParentList *)pSVar1 || (pDVar35 != local_e0))) {
      inputDecl_1 = (UdpInputPortDeclSyntax *)
                    slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                    iterator_base<slang::syntax::UdpPortDeclSyntax_*>::dereference
                              ((iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&__begin5);
      if ((inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind == UdpOutputPortDecl) {
        _port = *(Token *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode.parent;
        name_1 = (Token)parsing::Token::valueText((Token *)&port);
        uVar33 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_120,(basic_string_view<char,_std::char_traits<char>_> *)&name_1);
        uVar31 = uVar33 >> ((byte)local_120.arrays.groups_size_index & 0x3f);
        lVar45 = (uVar33 & 0xff) * 4;
        uVar76 = (&UNK_0040c7ac)[lVar45];
        bVar21 = (&UNK_0040c7ad)[lVar45];
        bVar59 = (&UNK_0040c7ae)[lVar45];
        bVar61 = (&UNK_0040c7af)[lVar45];
        SVar29 = (SourceLocation)0x0;
        uVar77 = uVar76;
        bVar64 = bVar21;
        bVar66 = bVar59;
        bVar68 = bVar61;
        uVar79 = uVar76;
        bVar71 = bVar21;
        bVar73 = bVar59;
        bVar75 = bVar61;
        uVar81 = uVar76;
        bVar78 = bVar21;
        bVar80 = bVar59;
        bVar82 = bVar61;
        do {
          ppVar13 = local_120.arrays.elements_;
          pgVar12 = local_120.arrays.groups_;
          pSVar2 = &((Symbol *)(local_120.arrays.groups_)->m)->kind + uVar31 * 4;
          bVar16 = *(uchar *)((long)pSVar2 + 0xf);
          auVar53[0] = -((char)*pSVar2 == uVar76);
          auVar53[1] = -(*(byte *)((long)pSVar2 + 1) == bVar21);
          auVar53[2] = -(*(byte *)((long)pSVar2 + 2) == bVar59);
          auVar53[3] = -(*(byte *)((long)pSVar2 + 3) == bVar61);
          auVar53[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar77);
          auVar53[5] = -(*(uchar *)((long)pSVar2 + 5) == bVar64);
          auVar53[6] = -(*(uchar *)((long)pSVar2 + 6) == bVar66);
          auVar53[7] = -(*(uchar *)((long)pSVar2 + 7) == bVar68);
          auVar53[8] = -((char)((string_view *)(pSVar2 + 2))->_M_len == uVar79);
          auVar53[9] = -(*(uchar *)((long)pSVar2 + 9) == bVar71);
          auVar53[10] = -(*(uchar *)((long)pSVar2 + 10) == bVar73);
          auVar53[0xb] = -(*(uchar *)((long)pSVar2 + 0xb) == bVar75);
          auVar53[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar81);
          auVar53[0xd] = -(*(uchar *)((long)pSVar2 + 0xd) == bVar78);
          auVar53[0xe] = -(*(uchar *)((long)pSVar2 + 0xe) == bVar80);
          auVar53[0xf] = -(bVar16 == bVar82);
          uVar42 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe);
          if (uVar42 != 0) {
            local_2e8._0_4_ = CONCAT13(bVar61,CONCAT12(bVar59,CONCAT11(bVar21,uVar76)));
            local_2e8._0_5_ = CONCAT14(uVar77,(uint32_t)local_2e8);
            local_2e8._0_6_ = CONCAT15(bVar64,(undefined5)local_2e8);
            local_2e8._0_7_ = CONCAT16(bVar66,(undefined6)local_2e8);
            local_2e8 = (PrimitivePortSymbol *)CONCAT17(bVar68,(undefined7)local_2e8);
            local_318 = SVar29;
            uStack_2e0 = uVar79;
            bStack_2df = bVar71;
            bStack_2de = bVar73;
            bStack_2dd = bVar75;
            uStack_2dc = uVar81;
            bStack_2db = bVar78;
            bStack_2da = bVar80;
            bStack_2d9 = bVar82;
            do {
              uVar7 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              pbVar46 = (basic_string_view<char,_std::char_traits<char>_> *)
                        (&(((Type *)((long)ppVar13 + uVar31 * 5 * 0x48))->super_Symbol).kind +
                        (ulong)uVar7 * 6);
              bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&local_120,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&name_1,
                                  pbVar46);
              pUVar48 = inputDecl_1;
              if (bVar17) {
                if ((*(long *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode == 0) ||
                   ((inputDecl_1->keyword).info != (Info *)0x0)) {
                  pPVar30 = (PrimitivePortSymbol *)pbVar46[1]._M_len;
                  fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::
                  $_0::operator()(&checkDup,pPVar30,_port);
                  pPVar30->direction =
                       OutReg - (*(long *)&(pUVar48->names).super_SyntaxListBase.super_SyntaxNode ==
                                0);
                  SVar29 = parsing::Token::location((Token *)&port);
                  (pPVar30->super_ValueSymbol).super_Symbol.location = SVar29;
                  (pPVar30->super_ValueSymbol).super_Symbol.originatingSyntax =
                       (SyntaxNode *)pUVar48;
                  syntax_04._M_ptr =
                       (pUVar48->super_UdpPortDeclSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       _M_ptr;
                  syntax_04._M_extent._M_extent_value =
                       (pUVar48->super_UdpPortDeclSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       _M_extent._M_extent_value;
                  Symbol::setAttributes((Symbol *)pPVar30,scope,syntax_04);
                  pUVar48 = pUVar47;
                }
                else if (pUVar47 != (UdpInputPortDeclSyntax *)0x0) {
                  SVar83 = parsing::Token::range((Token *)&inputDecl_1->names);
                  pDVar37 = Scope::addDiag(scope,(DiagCode)0xac0006,SVar83);
                  SVar29 = parsing::Token::location((Token *)&pUVar47->names);
                  Diagnostic::addNote(pDVar37,(DiagCode)0xa0001,SVar29);
                }
                goto LAB_001ee879;
              }
              uVar42 = uVar42 - 1 & uVar42;
            } while (uVar42 != 0);
            bVar16 = ((slot_type *)((long)&(&((Symbol *)pgVar12->m)->name)[uVar31]._M_len + 7))->n;
            SVar29 = local_318;
            uVar76 = (undefined1)local_2e8;
            bVar21 = local_2e8._1_1_;
            bVar59 = local_2e8._2_1_;
            bVar61 = local_2e8._3_1_;
            uVar77 = local_2e8._4_1_;
            bVar64 = local_2e8._5_1_;
            bVar66 = local_2e8._6_1_;
            bVar68 = local_2e8._7_1_;
            uVar79 = uStack_2e0;
            bVar71 = bStack_2df;
            bVar73 = bStack_2de;
            bVar75 = bStack_2dd;
            uVar81 = uStack_2dc;
            bVar78 = bStack_2db;
            bVar80 = bStack_2da;
            bVar82 = bStack_2d9;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7] & bVar16) == 0) break;
          lVar45 = uVar31 + (long)SVar29;
          SVar29 = (SourceLocation)((long)SVar29 + 1);
          uVar31 = lVar45 + 1U & local_120.arrays.groups_size_mask;
        } while ((ulong)SVar29 <= local_120.arrays.groups_size_mask);
        sVar84 = parsing::Token::valueText((Token *)&port);
        pUVar48 = pUVar47;
        if (sVar84._M_len != 0) {
          SVar83 = parsing::Token::range((Token *)&port);
          pDVar37 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar83);
          sVar84 = parsing::Token::valueText((Token *)&port);
          Diagnostic::operator<<(pDVar37,sVar84);
        }
      }
      else {
        SVar29 = (SourceLocation)&inputDecl_1->names;
        SStack_2d0 = (SourceLocation)0x0;
        port = (PrimitivePortSymbol *)SVar29;
        sVar44 = (inputDecl_1->names).elements._M_extent._M_extent_value;
        pIVar34 = (Info *)0x0;
        local_318 = SVar29;
        while ((SVar29 != local_318 || (pUVar48 = pUVar47, pIVar34 != (Info *)(sVar44 + 1 >> 1)))) {
          pPVar30 = (PrimitivePortSymbol *)
                    slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    iterator_base<slang::syntax::IdentifierNameSyntax_*>::dereference
                              ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&port);
          name_1.kind = *(TokenKind *)&(pPVar30->super_ValueSymbol).super_Symbol.location.field_0x0;
          name_1._2_1_ = (pPVar30->super_ValueSymbol).super_Symbol.location.field_0x2;
          name_1.numFlags.raw = (pPVar30->super_ValueSymbol).super_Symbol.location.field_0x3;
          name_1.rawLen = *(uint32_t *)&(pPVar30->super_ValueSymbol).super_Symbol.location.field_0x4
          ;
          name_1.info = (Info *)(pPVar30->super_ValueSymbol).super_Symbol.parentScope;
          _port_1 = parsing::Token::valueText(&name_1);
          uVar33 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_120,(basic_string_view<char,_std::char_traits<char>_> *)&port_1
                             );
          uVar31 = uVar33 >> ((byte)local_120.arrays.groups_size_index & 0x3f);
          lVar45 = (uVar33 & 0xff) * 4;
          uVar76 = (&UNK_0040c7ac)[lVar45];
          bVar21 = (&UNK_0040c7ad)[lVar45];
          bVar59 = (&UNK_0040c7ae)[lVar45];
          bVar61 = (&UNK_0040c7af)[lVar45];
          SVar29 = (SourceLocation)0x0;
          uVar77 = uVar76;
          bVar64 = bVar21;
          bVar66 = bVar59;
          bVar68 = bVar61;
          uVar79 = uVar76;
          bVar71 = bVar21;
          bVar73 = bVar59;
          bVar75 = bVar61;
          uVar81 = uVar76;
          bVar78 = bVar21;
          bVar80 = bVar59;
          bVar82 = bVar61;
          do {
            ppVar13 = local_120.arrays.elements_;
            pgVar12 = local_120.arrays.groups_;
            pSVar2 = &((Symbol *)(local_120.arrays.groups_)->m)->kind + uVar31 * 4;
            bVar16 = *(char *)((long)pSVar2 + 0xf);
            auVar54[0] = -((char)*pSVar2 == uVar76);
            auVar54[1] = -(*(byte *)((long)pSVar2 + 1) == bVar21);
            auVar54[2] = -(*(byte *)((long)pSVar2 + 2) == bVar59);
            auVar54[3] = -(*(byte *)((long)pSVar2 + 3) == bVar61);
            auVar54[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar77);
            auVar54[5] = -(*(char *)((long)pSVar2 + 5) == bVar64);
            auVar54[6] = -(*(char *)((long)pSVar2 + 6) == bVar66);
            auVar54[7] = -(*(char *)((long)pSVar2 + 7) == bVar68);
            auVar54[8] = -((char)((string_view *)(pSVar2 + 2))->_M_len == uVar79);
            auVar54[9] = -(*(char *)((long)pSVar2 + 9) == bVar71);
            auVar54[10] = -(*(char *)((long)pSVar2 + 10) == bVar73);
            auVar54[0xb] = -(*(char *)((long)pSVar2 + 0xb) == bVar75);
            auVar54[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar81);
            auVar54[0xd] = -(*(char *)((long)pSVar2 + 0xd) == bVar78);
            auVar54[0xe] = -(*(char *)((long)pSVar2 + 0xe) == bVar80);
            auVar54[0xf] = -(bVar16 == bVar82);
            uVar42 = (uint)(ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe);
            if (uVar42 != 0) {
              local_228._1_1_ = bVar21;
              local_228._0_1_ = uVar76;
              local_228._2_1_ = bVar59;
              local_228._3_1_ = bVar61;
              local_228._4_1_ = uVar77;
              local_228._5_1_ = bVar64;
              local_228._6_1_ = bVar66;
              local_228._7_1_ = bVar68;
              local_2e8 = pPVar30;
              local_230 = SVar29;
              uStack_220 = uVar79;
              bStack_21f = bVar71;
              bStack_21e = bVar73;
              bStack_21d = bVar75;
              uStack_21c = uVar81;
              bStack_21b = bVar78;
              bStack_21a = bVar80;
              bStack_219 = bVar82;
              do {
                uVar7 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                pbVar46 = (basic_string_view<char,_std::char_traits<char>_> *)
                          (&(((Type *)((long)ppVar13 + uVar31 * 5 * 0x48))->super_Symbol).kind +
                          (ulong)uVar7 * 6);
                bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_120,
                                    (basic_string_view<char,_std::char_traits<char>_> *)&port_1,
                                    pbVar46);
                if (bVar17) {
                  pPVar30 = (PrimitivePortSymbol *)pbVar46[1]._M_len;
                  fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::
                  $_0::operator()(&checkDup,pPVar30,name_1);
                  SVar29 = parsing::Token::location(&name_1);
                  (pPVar30->super_ValueSymbol).super_Symbol.location = SVar29;
                  (pPVar30->super_ValueSymbol).super_Symbol.originatingSyntax =
                       (SyntaxNode *)local_2e8;
                  syntax_03._M_ptr =
                       (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       _M_ptr;
                  syntax_03._M_extent._M_extent_value =
                       (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       _M_extent._M_extent_value;
                  Symbol::setAttributes((Symbol *)pPVar30,scope,syntax_03);
                  goto LAB_001ee7e1;
                }
                uVar42 = uVar42 - 1 & uVar42;
              } while (uVar42 != 0);
              bVar16 = ((slot_type *)((long)&(&((Symbol *)pgVar12->m)->name)[uVar31]._M_len + 7))->n
              ;
              SVar29 = local_230;
              pPVar30 = local_2e8;
              uVar76 = local_228._0_1_;
              bVar21 = local_228._1_1_;
              bVar59 = local_228._2_1_;
              bVar61 = local_228._3_1_;
              uVar77 = local_228._4_1_;
              bVar64 = local_228._5_1_;
              bVar66 = local_228._6_1_;
              bVar68 = local_228._7_1_;
              uVar79 = uStack_220;
              bVar71 = bStack_21f;
              bVar73 = bStack_21e;
              bVar75 = bStack_21d;
              uVar81 = uStack_21c;
              bVar78 = bStack_21b;
              bVar80 = bStack_21a;
              bVar82 = bStack_219;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7] & bVar16) == 0) break;
            lVar45 = uVar31 + (long)SVar29;
            SVar29 = (SourceLocation)((long)SVar29 + 1);
            uVar31 = lVar45 + 1U & local_120.arrays.groups_size_mask;
          } while ((ulong)SVar29 <= local_120.arrays.groups_size_mask);
          sVar84 = parsing::Token::valueText(&name_1);
          if (sVar84._M_len != 0) {
            SVar83 = parsing::Token::range(&name_1);
            pDVar37 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar83);
            sVar84 = parsing::Token::valueText(&name_1);
            Diagnostic::operator<<(pDVar37,sVar84);
          }
LAB_001ee7e1:
          SVar29 = (SourceLocation)port;
          pIVar34 = (Info *)((long)(char **)SStack_2d0 + 1);
          SStack_2d0 = (SourceLocation)pIVar34;
        }
      }
LAB_001ee879:
      pDVar35 = (pointer)(__begin5.index + 1);
      __begin5.index = (size_t)pDVar35;
      pPVar39 = __begin5.list;
      pUVar47 = pUVar48;
    }
    if (pUVar47 != (UdpInputPortDeclSyntax *)0x0) {
      __begin5.list = (ParentList *)(pUVar47->names).super_SyntaxListBase.super_SyntaxNode.parent;
      __begin5.index = (size_t)(pUVar47->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
      _port = (Token)parsing::Token::valueText((Token *)&__begin5);
      uVar33 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &local_120,(basic_string_view<char,_std::char_traits<char>_> *)&port);
      uVar31 = uVar33 >> ((byte)local_120.arrays.groups_size_index & 0x3f);
      lVar45 = (uVar33 & 0xff) * 4;
      uVar76 = (undefined1)*(uint32_t *)(&UNK_0040c7ac + lVar45);
      bVar21 = (&UNK_0040c7ad)[lVar45];
      bVar59 = (&UNK_0040c7ae)[lVar45];
      bVar61 = (&UNK_0040c7af)[lVar45];
      lVar51 = 0;
      local_2e8._0_5_ = CONCAT14(uVar76,*(uint32_t *)(&UNK_0040c7ac + lVar45));
      local_2e8._0_6_ = CONCAT15(bVar21,(undefined5)local_2e8);
      local_2e8._0_7_ = CONCAT16(bVar59,(undefined6)local_2e8);
      local_2e8 = (PrimitivePortSymbol *)CONCAT17(bVar61,(undefined7)local_2e8);
      uVar77 = uVar76;
      bVar64 = bVar21;
      bVar66 = bVar59;
      bVar68 = bVar61;
      uVar79 = uVar76;
      bVar71 = bVar21;
      bVar73 = bVar59;
      bVar75 = bVar61;
      uVar81 = uVar76;
      bVar78 = bVar21;
      bVar80 = bVar59;
      bVar82 = bVar61;
      uStack_2e0 = uVar76;
      bStack_2df = bVar21;
      bStack_2de = bVar59;
      bStack_2dd = bVar61;
      uStack_2dc = uVar76;
      bStack_2db = bVar21;
      bStack_2da = bVar59;
      bStack_2d9 = bVar61;
      do {
        ppVar13 = local_120.arrays.elements_;
        pSVar2 = &((Symbol *)(local_120.arrays.groups_)->m)->kind + uVar31 * 4;
        auVar55[0] = -((char)*pSVar2 == uVar76);
        auVar55[1] = -(*(byte *)((long)pSVar2 + 1) == bVar21);
        auVar55[2] = -(*(byte *)((long)pSVar2 + 2) == bVar59);
        auVar55[3] = -(*(byte *)((long)pSVar2 + 3) == bVar61);
        auVar55[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar77);
        auVar55[5] = -(*(char *)((long)pSVar2 + 5) == bVar64);
        auVar55[6] = -(*(char *)((long)pSVar2 + 6) == bVar66);
        auVar55[7] = -(*(char *)((long)pSVar2 + 7) == bVar68);
        auVar55[8] = -((char)((string_view *)(pSVar2 + 2))->_M_len == uVar79);
        auVar55[9] = -(*(char *)((long)pSVar2 + 9) == bVar71);
        auVar55[10] = -(*(char *)((long)pSVar2 + 10) == bVar73);
        auVar55[0xb] = -(*(char *)((long)pSVar2 + 0xb) == bVar75);
        auVar55[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar81);
        auVar55[0xd] = -(*(char *)((long)pSVar2 + 0xd) == bVar78);
        auVar55[0xe] = -(*(char *)((long)pSVar2 + 0xe) == bVar80);
        auVar55[0xf] = -(*(char *)((long)pSVar2 + 0xf) == bVar82);
        for (uVar42 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe); uVar42 != 0;
            uVar42 = uVar42 - 1 & uVar42) {
          uVar7 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          pbVar46 = (basic_string_view<char,_std::char_traits<char>_> *)
                    (&(((Type *)((long)ppVar13 + uVar31 * 5 * 0x48))->super_Symbol).kind +
                    (ulong)uVar7 * 6);
          bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &local_120,(basic_string_view<char,_std::char_traits<char>_> *)&port,
                              pbVar46);
          if (bVar17) {
            pPVar30 = (PrimitivePortSymbol *)pbVar46[1]._M_len;
            if ((pPVar30->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0) {
              if (pPVar30->direction == In) {
                SVar83 = parsing::Token::range((Token *)&__begin5);
                pDVar37 = Scope::addDiag(scope,(DiagCode)0xad0006,SVar83);
                Diagnostic::operator<<(pDVar37,(pPVar30->super_ValueSymbol).super_Symbol.name);
              }
              else if (pPVar30->direction == OutReg) {
                fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0
                ::operator()(&checkDup,pPVar30,(Token)__begin5);
              }
              else {
                pPVar30->direction = OutReg;
              }
            }
            goto LAB_001eea9a;
          }
          uVar76 = (undefined1)local_2e8;
          bVar21 = local_2e8._1_1_;
          bVar59 = local_2e8._2_1_;
          bVar61 = local_2e8._3_1_;
          uVar77 = local_2e8._4_1_;
          bVar64 = local_2e8._5_1_;
          bVar66 = local_2e8._6_1_;
          bVar68 = local_2e8._7_1_;
          uVar79 = uStack_2e0;
          bVar71 = bStack_2df;
          bVar73 = bStack_2de;
          bVar75 = bStack_2dd;
          uVar81 = uStack_2dc;
          bVar78 = bStack_2db;
          bVar80 = bStack_2da;
          bVar82 = bStack_2d9;
        }
        lVar45 = uVar31 + lVar51;
        lVar51 = lVar51 + 1;
        uVar31 = lVar45 + 1U & local_120.arrays.groups_size_mask;
      } while( true );
    }
LAB_001eea9a:
    ppPVar14 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
    lVar45 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len << 3;
    for (lVar51 = 0; lVar45 != lVar51; lVar51 = lVar51 + 8) {
      lVar5 = *(long *)((long)ppPVar14 + lVar51);
      if ((*(long *)(lVar5 + 0x38) == 0) && (*(long *)(lVar5 + 8) != 0)) {
        pDVar37 = Scope::addDiag(scope,(DiagCode)0xaa0006,*(SourceLocation *)(lVar5 + 0x18));
        Diagnostic::operator<<(pDVar37,*(string_view *)(lVar5 + 8));
      }
    }
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
    ::~table_core(&local_120);
    pEVar41 = extraout_RDX_06;
  }
  else {
    if (pSVar36->kind != AnsiUdpPortList) goto LAB_001ef7c2;
    local_2e8 = (PrimitivePortSymbol *)&pSVar36[1].previewNode;
    __begin3.index = 0;
    __begin3.list = (ParentList *)local_2e8;
    pSVar36 = pSVar36[3].previewNode;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_320->options;
    uVar31 = 0;
    pPVar30 = local_2e8;
    while ((pPVar30 != local_2e8 || (uVar31 != (ulong)((long)&pSVar36->kind + 1) >> 1))) {
      pUVar28 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                iterator_base<slang::syntax::UdpPortDeclSyntax_*>::dereference(&__begin3);
      if ((pUVar28->super_SyntaxNode).kind == UdpOutputPortDecl) {
        port_1._0_4_ = 2 - (uint)(pUVar28[1].attributes.super_SyntaxListBase._vptr_SyntaxListBase ==
                                 (_func_int **)0x0);
        pSVar27 = &pUVar28[1].attributes.super_SyntaxListBase.super_SyntaxNode;
        __begin5 = (iterator)parsing::Token::valueText((Token *)pSVar27);
        SVar29 = parsing::Token::location((Token *)pSVar27);
        name_1._0_8_ = SVar29;
        pPVar30 = BumpAllocator::
                  emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                            (&local_310->super_BumpAllocator,local_310,
                             (basic_string_view<char,_std::char_traits<char>_> *)&__begin5,
                             (SourceLocation *)&name_1,(PrimitivePortDirection *)&port_1);
        port = pPVar30;
        (pPVar30->super_ValueSymbol).super_Symbol.originatingSyntax = &pUVar28->super_SyntaxNode;
        syntax_01._M_ptr =
             (pUVar28->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_01._M_extent._M_extent_value =
             (pUVar28->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes((Symbol *)pPVar30,scope,syntax_01);
        SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
        emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port);
        Scope::addMember((Scope *)(paVar9 + 3),(Symbol *)port);
        pEVar41 = extraout_RDX_03;
      }
      else {
        ppSVar43 = &pUVar28[1].super_SyntaxNode.previewNode;
        __begin5.index = 0;
        __begin5.list = (ParentList *)ppSVar43;
        ppAVar3 = pUVar28[1].attributes.
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                  _M_ptr;
        uVar31 = 0;
        pPVar39 = (ParentList *)ppSVar43;
        pEVar41 = extraout_RDX_02;
        while ((pPVar39 != (ParentList *)ppSVar43 || (uVar31 != (long)ppAVar3 + 1U >> 1))) {
          pIVar32 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    iterator_base<slang::syntax::IdentifierNameSyntax_*>::dereference(&__begin5);
          _port = pIVar32->identifier;
          name_1 = (Token)parsing::Token::valueText((Token *)&port);
          checkDup.scope = (Scope *)parsing::Token::location((Token *)&port);
          alloc.head._0_4_ = 0;
          pPVar30 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                              (&local_310->super_BumpAllocator,local_310,
                               (basic_string_view<char,_std::char_traits<char>_> *)&name_1,
                               (SourceLocation *)&checkDup,(PrimitivePortDirection *)&alloc);
          port_1 = pPVar30;
          (pPVar30->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pIVar32;
          syntax_02._M_ptr =
               (pUVar28->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_02._M_extent._M_extent_value =
               (pUVar28->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)pPVar30,scope,syntax_02);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_1);
          Scope::addMember((Scope *)(paVar9 + 3),(Symbol *)port_1);
          uVar31 = __begin5.index + 1;
          __begin5.index = uVar31;
          pPVar39 = __begin5.list;
          pEVar41 = extraout_RDX_04;
        }
      }
      uVar31 = __begin3.index + 1;
      __begin3.index = uVar31;
      pPVar30 = (PrimitivePortSymbol *)__begin3.list;
    }
    pUVar4 = (local_210->body).ptr;
    if ((pUVar4->portDecls).elements._M_extent._M_extent_value != 0) {
      pSVar36 = slang::syntax::TokenOrSyntax::node((pUVar4->portDecls).elements._M_ptr);
      SVar83 = slang::syntax::SyntaxNode::sourceRange(pSVar36);
      Scope::addDiag(scope,(DiagCode)0xa20006,SVar83);
      pEVar41 = extraout_RDX_05;
    }
  }
  iVar25 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                      (EVP_PKEY_CTX *)local_310,pEVar41);
  *(ulong *)((long)&local_320->options + 0x68) = CONCAT44(extraout_var,iVar25);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&local_320->options)[7]._M_allocated_capacity = extraout_RDX_07;
  this_03 = (char *)0xae0006;
  pCVar50 = local_320;
  if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len < 2) {
LAB_001eeb62:
    Scope::addDiag(scope,SUB84(this_03,0),*(SourceLocation *)((long)&pCVar50->options + 8));
    goto LAB_001ef7c2;
  }
  pCVar50 = (Compilation *)
            *ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
  if (*(int *)&pCVar50->logicType == 2) {
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&local_320->options)[9]._M_local_buf[0] = 1;
    piVar6 = *(int **)((long)&pCVar50->options + 0x28);
    this_03 = (char *)local_320;
    if (((piVar6 == (int *)0x0) || (*piVar6 != 0x1e4)) || (*(long *)(piVar6 + 0x20) == 0))
    goto LAB_001eeb9f;
    pSVar36 = *(SyntaxNode **)(*(long *)(piVar6 + 0x20) + 0x28);
  }
  else {
    this_03 = (char *)0xa70006;
    if (*(int *)&pCVar50->logicType == 0) goto LAB_001eeb62;
LAB_001eeb9f:
    pSVar36 = (SyntaxNode *)0x0;
  }
  uVar31 = 1;
  do {
    if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len <= uVar31)
    goto LAB_001eebcc;
    this_03 = (char *)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_
                      [uVar31];
    uVar31 = uVar31 + 1;
  } while (*(int *)&((Compilation *)this_03)->logicType == 0);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&((Compilation *)this_03)->options;
  this_03 = (char *)0xa40006;
  Scope::addDiag(scope,(DiagCode)0xa40006,*(SourceLocation *)((long)paVar9 + 8));
LAB_001eebcc:
  this = ((local_210->body).ptr)->initialStmt;
  if (this == (UdpInitialStmtSyntax *)0x0) {
LAB_001eec67:
    if (pSVar36 != (SyntaxNode *)0x0) goto LAB_001eec70;
  }
  else {
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&local_320->options)[9]._M_local_buf[0] == '\0') {
      SVar83 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      this_03 = (char *)0xa60006;
      Scope::addDiag(scope,(DiagCode)0xa60006,SVar83);
      goto LAB_001eec67;
    }
    if (pSVar36 == (SyntaxNode *)0x0) {
      pSVar36 = &((this->value).ptr)->super_SyntaxNode;
      sVar84 = parsing::Token::valueText(&this->name);
      pCVar50 = (Compilation *)sVar84._M_str;
      if (sVar84._M_len != 0) {
        sVar44 = ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_)->
                 super_ValueSymbol).super_Symbol.name._M_len;
        if (sVar44 != 0) {
          __y._M_str = ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_
                        )->super_ValueSymbol).super_Symbol.name._M_str;
          __y._M_len = sVar44;
          bVar17 = std::operator==(sVar84,__y);
          this_03 = (char *)pCVar50;
          if (!bVar17) {
            SVar83 = parsing::Token::range(&this->name);
            pDVar37 = Scope::addDiag(scope,(DiagCode)0xaf0006,SVar83);
            Diagnostic::operator<<(pDVar37,sVar84);
            this_03 = (char *)0x50001;
            Diagnostic::addNote(pDVar37,(DiagCode)0x50001,
                                ((*ports.
                                   super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.
                                   data_)->super_ValueSymbol).super_Symbol.location);
          }
        }
      }
      goto LAB_001eec67;
    }
    SVar83 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
    pDVar37 = Scope::addDiag(scope,(DiagCode)0xa30006,SVar83);
    __begin3 = (iterator)slang::syntax::SyntaxNode::getFirstToken(pSVar36);
    SVar29 = parsing::Token::location((Token *)&__begin3);
    Diagnostic::addNote(pDVar37,(DiagCode)0xa0001,SVar29);
LAB_001eec70:
    this_03 = (char *)&__begin3;
    __begin3.index._0_4_ = 0xffffffff;
    __begin3.list = (ParentList *)scope;
    iVar25 = Expression::bind((int)pSVar36,(sockaddr *)this_03,0);
    this_01 = (Expression *)CONCAT44(extraout_var_00,iVar25);
    bVar17 = Expression::bad(this_01);
    if (!bVar17) {
      if ((this_01->kind == IntegerLiteral) &&
         ((bVar26 = Type::getBitWidth((this_01->type).ptr), bVar26 == 1 ||
          (bVar17 = Expression::isUnsizedInteger(this_01), bVar17)))) {
        this_03 = (char *)&__begin3;
        ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)this_03,this_01,
                         (bitmask<slang::ast::EvalFlags>)0x0);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        if (&this_01->constant->value !=
            (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             *)0x0) {
          this_02 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (&this_01->constant->value);
          SVInt::SVInt<int>((SVInt *)&__begin5,0);
          lVar18 = SVInt::operator==(this_02,(SVInt *)&__begin5);
          SVInt::SVInt<int>((SVInt *)&port,1);
          this_03 = (char *)&port;
          lVar19 = SVInt::operator==(this_02,(SVInt *)this_03);
          bVar17 = false;
          cVar20 = -0x80;
          if (lVar19.value == '\0' && lVar18.value == '\0') {
            cVar20 = bVar17;
          }
          if (lVar19.value == '\x01') {
            cVar20 = '\x01';
          }
          if (lVar18.value == '\x01') {
            cVar20 = '\x01';
          }
          if ((this_02->super_SVIntStorage).bitWidth == 1) {
            this_03 = (char *)0x0;
            lVar18 = SVInt::operator[](this_02,0);
            bVar17 = lVar18.value == 0x80;
          }
          SVInt::~SVInt((SVInt *)&port);
          SVInt::~SVInt((SVInt *)&__begin5);
          if ((bVar17 != false) || (cVar20 != '\0' && (cVar20 != -0x80 && cVar20 != '@'))) {
            *(ConstantValue **)((long)&local_320->options + 0x88) = this_01->constant;
          }
        }
      }
      if (*(long *)((long)&local_320->options + 0x88) == 0) {
        this_03 = (char *)0xa50006;
        Scope::addDiag(scope,(DiagCode)0xa50006,this_01->sourceRange);
      }
    }
  }
  __begin3.list = (ParentList *)0x0;
  __begin3.index = 0;
  BumpAllocator::BumpAllocator(&alloc);
  trieAlloc.freeList = (FreeNode *)0x0;
  __begin5.index = 0;
  __begin5.list = (ParentList *)local_1d0;
  pUVar4 = (local_210->body).ptr;
  SVar40 = (SourceLocation)
           (pUVar4->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
           _M_ptr;
  SVar29 = (SourceLocation)
           ((long)SVar40 +
           (pUVar4->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
           _M_extent._M_extent_value * 8);
  pEVar41 = extraout_RDX_08;
  trieAlloc.alloc = &alloc;
  while (SVar40 != SVar29) {
    local_228 = *(SourceLocation *)SVar40;
    SStack_2d0 = (SourceLocation)0x0;
    port = (PrimitivePortSymbol *)((long)local_2c8 + 8);
    local_2c8[0]._M_allocated_capacity = 0x28;
    pPVar30 = *(PrimitivePortSymbol **)((long)local_228 + 0x40);
    lVar45 = *(long *)((long)local_228 + 0x48);
    pVVar10 = &pPVar30->super_ValueSymbol;
    bVar17 = true;
    cVar20 = '\0';
    inputDecl_1 = (UdpInputPortDeclSyntax *)0x0;
    local_318 = (SourceLocation)
                ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
    SVar49 = (SourceLocation)
             ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
    local_230 = SVar40;
    while (pPVar30 !=
           (PrimitivePortSymbol *)
           ((long)&((SyntaxNode *)&(pVVar10->super_Symbol).kind)->kind + lVar45 * 8)) {
      pSVar36 = *(SyntaxNode **)&(pPVar30->super_ValueSymbol).super_Symbol;
      local_2e8 = pPVar30;
      if (pSVar36->kind == UdpEdgeField) {
        name_1.kind._0_1_ = 0x28;
        this_03 = (char *)&name_1;
        SmallVectorBase<char>::emplace_back<char>((SmallVectorBase<char> *)&port,this_03);
        name_1.info = (Info *)0x0;
        name_1._0_8_ = (long)local_278 + 8;
        local_278[0]._M_allocated_capacity = (pointer)0x28;
        sVar84 = parsing::Token::rawText((Token *)&pSVar36[1].previewNode);
        for (sVar44 = 0; sVar84._M_len != sVar44; sVar44 = sVar44 + 1) {
          cVar20 = charToLower(sVar84._M_str[sVar44]);
          port_1._0_1_ = cVar20;
          this_03 = (char *)&port_1;
          SmallVectorBase<char>::emplace_back<char>
                    ((SmallVectorBase<char> *)&name_1,(char *)&port_1);
        }
        sVar84 = parsing::Token::rawText((Token *)&pSVar36[2].parent);
        for (sVar44 = 0; SVar49 = local_318, sVar84._M_len != sVar44; sVar44 = sVar44 + 1) {
          cVar20 = charToLower(sVar84._M_str[sVar44]);
          port_1._0_1_ = cVar20;
          this_03 = (char *)&port_1;
          SmallVectorBase<char>::emplace_back<char>
                    ((SmallVectorBase<char> *)&name_1,(char *)&port_1);
        }
        pIVar34 = name_1.info;
        if (name_1.info == (Info *)0x2) {
          if (*(char *)name_1._0_8_ == '?') {
            if (*(char *)(name_1._0_8_ + 1) == 'x') {
              port_1._0_1_ = 0x62;
              SmallVectorBase<char>::emplace_back<char>
                        ((SmallVectorBase<char> *)&port,(char *)&port_1);
              port_1._0_1_ = 0x78;
              SmallVectorBase<char>::emplace_back<char>
                        ((SmallVectorBase<char> *)&port,(char *)&port_1);
              goto LAB_001ef0fa;
            }
LAB_001ef0fe:
            SmallVectorBase<char>::emplace_back<char_const&>
                      ((SmallVectorBase<char> *)&port,(char *)name_1._0_8_);
            SmallVectorBase<char>::emplace_back<char_const&>
                      ((SmallVectorBase<char> *)&port,(char *)(name_1._0_8_ + 1));
            bVar17 = (bool)((*(char *)(name_1._0_8_ + 1) == 'x' && *(char *)name_1._0_8_ == 'x') &
                           bVar17);
          }
          else {
            if ((*(char *)name_1._0_8_ != 'x') || (*(char *)(name_1._0_8_ + 1) != '?'))
            goto LAB_001ef0fe;
            port_1._0_1_ = 0x78;
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)&port,(char *)&port_1);
            port_1._0_1_ = 0x62;
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)&port,(char *)&port_1);
LAB_001ef0fa:
            bVar17 = false;
          }
          port_1._0_1_ = 0x29;
          this_03 = (char *)&port_1;
          SmallVectorBase<char>::emplace_back<char>((SmallVectorBase<char> *)&port,(char *)&port_1);
          inputDecl_1 = (UdpInputPortDeclSyntax *)
                        ((long)&(inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind + 1);
        }
        SmallVectorBase<char>::cleanup((SmallVectorBase<char> *)&name_1,(EVP_PKEY_CTX *)this_03);
        cVar20 = '\x01';
        if (pIVar34 != (Info *)0x2) goto LAB_001ef39b;
      }
      else {
        name_1 = *(Token *)(pSVar36 + 1);
        sVar84 = parsing::Token::rawText(&name_1);
        inputDecl_1 = (UdpInputPortDeclSyntax *)
                      ((long)&(inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind +
                      sVar84._M_len);
        for (sVar44 = 0; SVar49 = local_318, sVar84._M_len != sVar44; sVar44 = sVar44 + 1) {
          bVar21 = charToLower(sVar84._M_str[sVar44]);
          port_1._0_1_ = bVar21;
          if (((bVar21 - 0x66 < 0xd) && ((0x1501U >> (bVar21 - 0x66 & 0x1f) & 1) != 0)) ||
             (bVar21 == 0x2a)) {
            cVar20 = '\x01';
          }
          this_03 = (char *)&port_1;
          SmallVectorBase<char>::emplace_back<char_const&>
                    ((SmallVectorBase<char> *)&port,(char *)&port_1);
          bVar17 = (bool)(bVar17 & (byte)port_1 == 'x');
        }
      }
      pPVar30 = (PrimitivePortSymbol *)&(local_2e8->super_ValueSymbol).super_Symbol.name;
    }
    if (((ulong)SVar49 < 2) ||
       (pCVar50 = (Compilation *)((long)SVar49 + -1), (Compilation *)inputDecl_1 == pCVar50)) {
      if (*(anon_class_1_0_00000001 **)((long)local_228 + 0x60) == (anon_class_1_0_00000001 *)0x0) {
        stateChar = '\0';
      }
      else {
        stateChar = createTableRow::anon_class_1_0_00000001::operator()
                              (*(anon_class_1_0_00000001 **)((long)local_228 + 0x60),
                               (UdpFieldBaseSyntax *)this_03);
        if (stateChar == '\0') goto LAB_001ef39b;
      }
      cVar22 = createTableRow::anon_class_1_0_00000001::operator()
                         (*(anon_class_1_0_00000001 **)((long)local_228 + 0x78),
                          (UdpFieldBaseSyntax *)this_03);
      if (cVar22 != '\0') {
        name_1.info = (Info *)0x0;
        name_1._0_8_ = (long)local_278 + 8;
        local_278[0]._M_allocated_capacity = (pointer)0x5;
        inputDecl_1 = (UdpInputPortDeclSyntax *)CONCAT44(inputDecl_1._4_4_,(int)stateChar);
        SVar40 = SStack_2d0;
        SVar49 = local_228;
        BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
                  ((BitTrie *)&__begin3,(UdpEntrySyntax *)local_228,
                   (span<const_char,_18446744073709551615UL>)_port,stateChar,&trieAlloc,
                   (SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> *)&name_1);
        local_2e8 = (PrimitivePortSymbol *)CONCAT71(local_2e8._1_7_,cVar22);
        pEVar41 = extraout_RDX_09;
        if (name_1.info == (Info *)0x0) {
          if ((cVar22 == 'x') || (!bVar17)) goto LAB_001ef34b;
          SVar83 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_228);
          this_03 = (char *)0xca0006;
          Scope::addDiag(scope,(DiagCode)0xca0006,SVar83);
        }
        else {
          uVar11 = name_1._0_8_;
          lVar45 = (long)name_1.info << 3;
          local_318._0_4_ = (int)cVar22;
          for (lVar51 = 0; lVar45 != lVar51; lVar51 = lVar51 + 8) {
            pSVar36 = *(SyntaxNode **)(uVar11 + lVar51);
            cVar22 = createTableRow::anon_class_1_0_00000001::operator()
                               (*(anon_class_1_0_00000001 **)(pSVar36 + 5),
                                (UdpFieldBaseSyntax *)SVar49);
            cVar23 = createTableRow::anon_class_1_0_00000001::operator()
                               (*(anon_class_1_0_00000001 **)(pSVar36 + 4),
                                (UdpFieldBaseSyntax *)SVar49);
            pEVar41 = extraout_RDX_10;
            if (cVar22 != (undefined1)local_2e8) {
              SVar49._4_4_ = 0;
              SVar49._0_4_ = (int)cVar22;
              bVar17 = createTableRow::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)(ulong)(uint)(int)cVar23,cVar22,
                                  local_318._0_1_,SUB81(SVar40,0));
              pEVar41 = extraout_RDX_11;
              if (!bVar17) {
                SVar49 = (SourceLocation)((ulong)local_318 & 0xffffffff);
                bVar17 = createTableRow::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)((ulong)inputDecl_1 & 0xffffffff),
                                    local_318._0_1_,cVar22,SUB81(SVar40,0));
                pEVar41 = extraout_RDX_12;
                if (!bVar17) {
                  SVar83 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_228);
                  pDVar37 = Scope::addDiag(scope,(DiagCode)0xcb0006,SVar83);
                  SVar83 = slang::syntax::SyntaxNode::sourceRange(pSVar36);
                  this_03 = (char *)0xa0001;
                  Diagnostic::addNote(pDVar37,(DiagCode)0xa0001,SVar83);
                  goto LAB_001ef38e;
                }
              }
            }
          }
LAB_001ef34b:
          local_300._0_4_ =
               SmallVectorBase<char>::copy
                         ((SmallVectorBase<char> *)&port,(EVP_PKEY_CTX *)scope->compilation,pEVar41)
          ;
          local_300._4_4_ = extraout_var_01;
          port_1 = (PrimitivePortSymbol *)extraout_RDX_13;
          local_2f8._M_local_buf[1] = (undefined1)local_2e8;
          this_03 = (char *)&port_1;
          local_2f8._M_local_buf[0] = stateChar;
          local_2f8._M_local_buf[2] = cVar20;
          SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
          emplace_back<slang::ast::PrimitiveSymbol::TableEntry>
                    ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&__begin5,
                     (TableEntry *)&port_1);
        }
LAB_001ef38e:
        SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>::cleanup
                  ((SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*> *)&name_1,
                   (EVP_PKEY_CTX *)this_03);
      }
    }
    else {
      SVar83 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)((long)local_228 + 0x20));
      pDVar37 = Scope::addDiag(scope,(DiagCode)0xcc0006,SVar83);
      Diagnostic::operator<<<unsigned_long>(pDVar37,(unsigned_long)inputDecl_1);
      Diagnostic::operator<<<unsigned_long>(pDVar37,(unsigned_long)pCVar50);
      this_03 = (char *)pCVar50;
    }
LAB_001ef39b:
    SmallVectorBase<char>::cleanup((SmallVectorBase<char> *)&port,(EVP_PKEY_CTX *)this_03);
    if ((__begin5.index != 0) && (*(char *)((long)&local_320->options + 0x91) == '\0')) {
      *(undefined1 *)((long)&local_320->options + 0x91) =
           *(undefined1 *)((long)__begin5.list + __begin5.index * 0x18 + -6);
    }
    pEVar41 = extraout_RDX_14;
    SVar40 = (SourceLocation)((long)local_230 + 8);
  }
  this_03 = (char *)local_310;
  iVar25 = SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::copy
                     ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&__begin5,
                      (EVP_PKEY_CTX *)local_310,pEVar41);
  *(ulong *)((long)&local_320->options + 0x78) = CONCAT44(extraout_var_02,iVar25);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&local_320->options)[8]._M_allocated_capacity = extraout_RDX_15;
  if ((extraout_RDX_15 != 0 & *(byte *)((long)&local_320->options + 0x91)) == 1) {
    lVar45 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_320->options)[7]._M_allocated_capacity;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&port,AllPrimEdges,(allocator<char> *)&name_1);
    __n = lVar45 - 2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,__n,'0');
    name_1._0_8_ = local_278;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_1,__n,'x')
    ;
    port_1 = (PrimitivePortSymbol *)0x4;
    local_300 = (byte *)0x415d25;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&name_1,(basic_string_view<char,_std::char_traits<char>_> *)&port_1);
    local_300 = (byte *)0x0;
    port_1 = (PrimitivePortSymbol *)&local_2f8;
    local_2f8._M_local_buf[0] = '\0';
    pCVar50 = scope->compilation;
    local_310 = (Compilation *)0x0;
    uVar42 = 0;
LAB_001ef529:
    bVar17 = BitTrie::contains((BitTrie *)&__begin3,(span<const_char,_18446744073709551615UL>)_port,
                               '?');
    if (!bVar17) {
      if (local_310 == (Compilation *)0x0) {
        local_310 = (Compilation *)
                    Scope::addDiag(scope,(DiagCode)0xfa0006,
                                   *(SourceLocation *)((long)&local_320->options + 8));
      }
      if ((pCVar50->options).maxUDPCoverageNotes <= uVar42) {
        this_03 = "...and more\n";
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                   "...and more\n");
        goto LAB_001ef74f;
      }
      local_2e8 = (PrimitivePortSymbol *)CONCAT44(local_2e8._4_4_,uVar42);
      pPVar30 = port;
      SVar29 = SStack_2d0;
      bVar17 = true;
      for (pIVar34 = (Info *)0x0; SVar29 != (SourceLocation)pIVar34;
          pIVar34 = (Info *)((long)&pIVar34->rawTextPtr + 1)) {
        cVar20 = *(char *)((long)&pIVar34->rawTextPtr + (long)&pPVar30->super_ValueSymbol);
        if (cVar20 == '(') {
          bVar17 = false;
        }
        else if (cVar20 == ')') {
          bVar17 = true;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                   cVar20);
        if (bVar17) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                     ' ');
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,'\n');
      uVar42 = (uint32_t)local_2e8 + 1;
    }
    if ((&port[-1].field_0x157)[(long)SStack_2d0] == ')') {
      this_03 = (char *)&name_1;
      _Var24 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &port,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)this_03);
      if (_Var24) goto LAB_001ef747;
    }
    for (pIVar34 = (Info *)0x0; pIVar34 < (ulong)SStack_2d0;
        pIVar34 = (Info *)((long)&pIVar34->rawTextPtr + 1)) {
      cVar20 = *(char *)((long)&pIVar34->rawTextPtr + (long)&port->super_ValueSymbol);
      __x._M_str = (char *)((long)&pIVar34->rawTextPtr + (long)&port->super_ValueSymbol);
      if (cVar20 == '(') {
        checkDup.scope = (Scope *)0x4;
        __x._M_len = 4;
        bVar17 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (DAT_005b1ce0 + -0x10));
        if (!bVar17) {
          _Var38 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                             (AllPrimEdges,DAT_005b1ce0,&checkDup);
          std::__cxx11::string::replace<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&port,(size_type)pIVar34,4,_Var38._M_current + 1);
          break;
        }
        if ((&port[-1].field_0x157)[(long)SStack_2d0] == 'x') {
          local_321 = '0';
          std::ranges::__fill_fn::
          operator()<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    ((__fill_fn *)&std::ranges::fill,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,
                     &local_321);
          std::__cxx11::string::replace<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&port,(size_type)((long)&pIVar34->rawTextPtr + 1),4,AllPrimEdges);
          break;
        }
        std::__cxx11::string::replace<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&port,(size_type)pIVar34,4,AllPrimEdges);
        pIVar34 = (Info *)((long)&pIVar34->rawTextPtr + 3);
      }
      else {
        if (cVar20 == '0') {
          *__x._M_str = '1';
          break;
        }
        if (cVar20 == '1') {
          *__x._M_str = 'x';
          break;
        }
        *__x._M_str = '0';
      }
    }
    goto LAB_001ef529;
  }
  goto LAB_001ef7a8;
LAB_001ef747:
  if (local_310 != (Compilation *)0x0) {
LAB_001ef74f:
    if (local_300 != (byte *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1);
      pDVar37 = Diagnostic::addNote((Diagnostic *)local_310,(DiagCode)0xe70006,
                                    (SourceLocation)0xffffffffffffffff);
      this_03 = (char *)&port_1;
      Diagnostic::operator<<(pDVar37,(string *)this_03);
    }
  }
  std::__cxx11::string::~string((string *)&port_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::__cxx11::string::~string((string *)&port);
LAB_001ef7a8:
  SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::cleanup
            ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&__begin5,
             (EVP_PKEY_CTX *)this_03);
  BumpAllocator::~BumpAllocator(&alloc);
LAB_001ef7c2:
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::cleanup
            (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
             (EVP_PKEY_CTX *)this_03);
  return (PrimitiveSymbol *)local_320;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto primName = syntax.name.valueText();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, primName, syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    auto portList = syntax.portList.get();
    if (portList->kind == SyntaxKind::WildcardUdpPortList) {
        auto externPrim = comp.getExternDefinition(primName, scope);
        if (!externPrim || externPrim->kind != SyntaxKind::ExternUdpDecl)
            scope.addDiag(diag::MissingExternWildcardPorts, portList->sourceRange()) << primName;
        else
            portList = externPrim->as<ExternUdpDeclSyntax>().portList;
    }

    SmallVector<const PrimitivePortSymbol*> ports;
    if (portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<std::string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                auto name = outputDecl.name;
                if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else if (!name.valueText().empty()) {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                    diag << name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else if (!name.valueText().empty()) {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            SLANG_ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax() && !port->name.empty()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else {
        // This is an error condition (wildcard port list without a
        // corresponding extern decl). The error has already been
        // issued so just get out of here.
        return *prim;
    }

    prim->ports = ports.copy(comp);
    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }

        BitTrie trie;
        BumpAllocator alloc;
        PoolAllocator<BitTrie> trieAlloc(alloc);
        SmallVector<TableEntry> table;
        for (auto entry : syntax.body->entries) {
            createTableRow(scope, *entry, table, ports.size(), trie, trieAlloc);
            if (!table.empty() && !prim->isEdgeSensitive)
                prim->isEdgeSensitive = table.back().isEdgeSensitive;
        }

        prim->table = table.copy(comp);
        checkPrimitiveEdgeCombinations(*prim, scope, trie);
    }

    return *prim;
}